

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::internal::UnitTestImpl::PostFlagParsingInit(UnitTestImpl *this)

{
  UnitTestImpl *in_RDI;
  UnitTestImpl *in_stack_00000060;
  UnitTestImpl *in_stack_00000070;
  
  if ((in_RDI->post_flag_parse_init_performed_ & 1U) == 0) {
    in_RDI->post_flag_parse_init_performed_ = true;
    InitDeathTestSubprocessControlInfo(in_RDI);
    SuppressTestEventsIfInSubprocess(in_RDI);
    RegisterParameterizedTests(in_RDI);
    ConfigureXmlOutput(in_stack_00000070);
    ConfigureStreamingOutput(in_stack_00000060);
  }
  return;
}

Assistant:

void UnitTestImpl::PostFlagParsingInit() {
  // Ensures that this function does not execute more than once.
  if (!post_flag_parse_init_performed_) {
    post_flag_parse_init_performed_ = true;

#if GTEST_HAS_DEATH_TEST
    InitDeathTestSubprocessControlInfo();
    SuppressTestEventsIfInSubprocess();
#endif  // GTEST_HAS_DEATH_TEST

    // Registers parameterized tests. This makes parameterized tests
    // available to the UnitTest reflection API without running
    // RUN_ALL_TESTS.
    RegisterParameterizedTests();

    // Configures listeners for XML output. This makes it possible for users
    // to shut down the default XML output before invoking RUN_ALL_TESTS.
    ConfigureXmlOutput();

#if GTEST_CAN_STREAM_RESULTS_
    // Configures listeners for streaming test results to the specified server.
    ConfigureStreamingOutput();
#endif  // GTEST_CAN_STREAM_RESULTS_
  }
}